

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexed_vector.h
# Opt level: O0

void ipx::
     for_each_nonzero<ipx::Crossover::PrimalRatioTest(std::valarray<double>const&,ipx::IndexedVector_const&,std::valarray<double>const&,std::valarray<double>const&,double,double,bool*)::__1>
               (IndexedVector *v,anon_class_56_7_6d025434 *c)

{
  bool bVar1;
  Int IVar2;
  Int *pIVar3;
  anon_class_56_7_6d025434 *in_RSI;
  IndexedVector *in_RDI;
  Int ii;
  Int i_1;
  Int dim;
  Int i;
  Int p;
  Int nnz;
  Int *pattern;
  Int in_stack_ffffffffffffffac;
  IndexedVector *in_stack_ffffffffffffffb0;
  IndexedVector *in_stack_ffffffffffffffc0;
  undefined4 local_2c;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe4;
  undefined8 in_stack_ffffffffffffffe8;
  
  bVar1 = IndexedVector::sparse(in_stack_ffffffffffffffc0);
  if (bVar1) {
    pIVar3 = IndexedVector::pattern((IndexedVector *)0x819868);
    IVar2 = IndexedVector::nnz(in_RDI);
    for (iVar4 = 0; iVar4 < IVar2; iVar4 = iVar4 + 1) {
      IndexedVector::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      Crossover::PrimalRatioTest::anon_class_56_7_6d025434::operator()
                (in_RSI,(Int)((ulong)pIVar3 >> 0x20),(double)CONCAT44(IVar2,iVar4));
    }
  }
  else {
    IVar2 = IndexedVector::dim((IndexedVector *)0x8198e5);
    for (local_2c = 0; local_2c < IVar2; local_2c = local_2c + 1) {
      IndexedVector::operator[]((IndexedVector *)in_RSI,in_stack_ffffffffffffffac);
      Crossover::PrimalRatioTest::anon_class_56_7_6d025434::operator()
                (in_RSI,(Int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                 (double)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
  }
  return;
}

Assistant:

void for_each_nonzero(const IndexedVector& v, C& c) {
    if (v.sparse()) {
        const Int* pattern = v.pattern();
        Int nnz = v.nnz();
        for (Int p = 0; p < nnz; p++) {
            const Int i = pattern[p];
            c(i, v[i]);
        }
    } else {
        Int dim = v.dim();
        for (Int i = 0; i < dim; i++) {
            const Int ii = i;   // make sure that caller does not change i
            c(ii, v[i]);
        }
    }
}